

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

PrefixRange __thiscall
Potassco::ProgramOptions::OptionContext::findImpl
          (OptionContext *this,char *key,FindType t,uint eMask,string *eCtx)

{
  _Rb_tree_header *__y;
  _Base_ptr __n;
  int iVar1;
  size_t sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  UnknownOption *this_00;
  ContextError *this_01;
  long lVar5;
  bool bVar6;
  PrefixRange PVar7;
  string k;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  string local_50;
  
  if (key == (char *)0x0) {
    key = "";
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  sVar2 = strlen(key);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,key,key + sVar2);
  if (((t == find_alias) && ((_Base_ptr)local_78._M_string_length != (_Base_ptr)0x0)) &&
     (*local_78._M_dataplus._M_p != '-')) {
    std::__cxx11::string::push_back((char)&local_78);
    *local_78._M_dataplus._M_p = '-';
  }
  __y = &(this->index_)._M_t._M_impl.super__Rb_tree_header;
  local_58 = eCtx;
  PVar7.first._M_node =
       std::
       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)this,(_Const_Link_type)
                                (this->index_)._M_t._M_impl.super__Rb_tree_header._M_header.
                                _M_parent,&__y->_M_header,&local_78);
  cVar3 = PVar7.first._M_node;
  if ((_Rb_tree_header *)PVar7.first._M_node != __y) {
    __n = PVar7.first._M_node[1]._M_parent;
    bVar6 = true;
    if (__n == (_Base_ptr)local_78._M_string_length) {
      if (__n == (_Base_ptr)0x0) {
        bVar6 = false;
      }
      else {
        iVar1 = bcmp(*(void **)(PVar7.first._M_node + 1),local_78._M_dataplus._M_p,(size_t)__n);
        bVar6 = iVar1 != 0;
      }
    }
    if (((t & (find_alias|find_name)) == 0) || (bVar6)) {
      if ((t & find_prefix) != 0) {
        std::__cxx11::string::push_back((char)&local_78);
        cVar3 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::_M_upper_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                                  *)this,(_Const_Link_type)
                                         (this->index_)._M_t._M_impl.super__Rb_tree_header._M_header
                                         ._M_parent,&__y->_M_header,&local_78);
        std::__cxx11::string::_M_erase
                  ((ulong)&local_78,
                   (ulong)((long)&((_Base_ptr)(local_78._M_string_length + -0x20))->_M_right + 7));
      }
    }
    else {
      cVar3._M_node = (_Base_ptr)std::_Rb_tree_increment(PVar7.first._M_node);
    }
  }
  if (PVar7.first._M_node == cVar3._M_node) {
    bVar6 = true;
  }
  else {
    lVar5 = 1;
    cVar4 = PVar7.first._M_node;
    do {
      cVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar4._M_node);
      lVar5 = lVar5 + -1;
    } while (cVar4._M_node != cVar3._M_node);
    bVar6 = lVar5 != 0;
  }
  if (!(bool)(bVar6 ^ 1U | eMask == 0)) {
    if (((eMask & 1) != 0) && (PVar7.first._M_node == cVar3._M_node)) {
      this_00 = (UnknownOption *)__cxa_allocate_exception(0x58);
      UnknownOption::UnknownOption(this_00,local_58,&local_78);
      __cxa_throw(this_00,&UnknownOption::typeinfo,ContextError::~ContextError);
    }
    if (((eMask & 2) != 0) && (PVar7.first._M_node != cVar3._M_node)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      do {
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::_M_append((char *)&local_50,*(ulong *)(PVar7.first._M_node + 1));
        std::__cxx11::string::append((char *)&local_50);
        PVar7.first._M_node = (_Base_ptr)std::_Rb_tree_increment(PVar7.first._M_node);
      } while (PVar7.first._M_node != cVar3._M_node);
      this_01 = (ContextError *)__cxa_allocate_exception(0x58);
      ContextError::ContextError(this_01,local_58,ambiguous_option,&local_78,&local_50);
      *(undefined ***)&this_01->super_Error = &PTR__ContextError_0012ca30;
      __cxa_throw(this_01,&AmbiguousOption::typeinfo,ContextError::~ContextError);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  PVar7.second._M_node = cVar3._M_node;
  return PVar7;
}

Assistant:

OptionContext::PrefixRange OptionContext::findImpl(const char* key, FindType t, unsigned eMask, const std::string& eCtx) const {
	std::string k(key ? key : "");
	if (t == find_alias && !k.empty() && k[0] != '-') {
		k += k[0];
		k[0] = '-';
	}
	index_iterator it = index_.lower_bound(k);
	index_iterator up = it;
	if (it != index_.end()) {
		if ((it->first == k) && ((t & (find_alias|find_name)) != 0)) {
			++up;
		}
		else if ((t & find_prefix) != 0) {
			k += char(CHAR_MAX);
			up = index_.upper_bound(k);
			k.erase(k.end()-1);
		}
	}
	if (std::distance(it, up) != 1 && eMask) {
		if ((eMask & 1u) && it == up) { throw UnknownOption(eCtx, k); }
		if ((eMask & 2u) && it != up) {
			std::string str;
			for (; it != up; ++it) {
				str += "  ";
				str += it->first;
				str += "\n";
			}
			throw AmbiguousOption(eCtx, k, str);
		}
	}
	return PrefixRange(it, up);
}